

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Measurement.cpp
# Opt level: O2

void __thiscall
Measurement::Measurement(Measurement *this,Sensor *sensor,long timestamp,VectorXd *measurements)

{
  this->_vptr_Measurement = (_func_int **)&PTR___cxa_pure_virtual_0017bb98;
  this->sensor_ = sensor;
  this->timestamp_ = timestamp;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->measurements_,measurements);
  (this->estimate_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  (this->ground_truth_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (double *)0x0;
  this->nis_ = 0.0;
  (this->estimate_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  (this->ground_truth_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  return;
}

Assistant:

Measurement::Measurement(const Sensor *sensor, long timestamp, const VectorXd& measurements) :
        sensor_(sensor),
	timestamp_(timestamp),
	measurements_(measurements),
	nis_(0.0)
{
    //std::cout << measurements_.transpose() << std::endl;
}